

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquerymgr.cc
# Opt level: O3

int __thiscall bdQueryManager::QuerySummary(bdQueryManager *this,bdNodeId *id,bdQuerySummary *query)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  int iVar3;
  long lVar4;
  _List_node_base *p_Var5;
  
  p_Var5 = (_List_node_base *)&this->mLocalQueries;
  do {
    p_Var5 = (((_List_base<bdQuery_*,_std::allocator<bdQuery_*>_> *)&p_Var5->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)&this->mLocalQueries) {
      return 0;
    }
    iVar3 = operator==((bdNodeId *)p_Var5[1]._M_next,id);
  } while (iVar3 == 0);
  puVar1 = &(p_Var5[1]._M_next)->_M_next;
  *(undefined4 *)((query->mId).data + 0x10) = *(undefined4 *)(puVar1 + 2);
  uVar2 = puVar1[1];
  *(undefined8 *)(query->mId).data = *puVar1;
  *(undefined8 *)((query->mId).data + 8) = uVar2;
  lVar4 = (long)p_Var5[1]._M_next;
  *(undefined4 *)((query->mLimit).super_bdNodeId.data + 0x10) = *(undefined4 *)(lVar4 + 0x24);
  uVar2 = *(undefined8 *)(lVar4 + 0x1c);
  *(undefined8 *)(query->mLimit).super_bdNodeId.data = *(undefined8 *)(lVar4 + 0x14);
  *(undefined8 *)((query->mLimit).super_bdNodeId.data + 8) = uVar2;
  lVar4 = (long)p_Var5[1]._M_next;
  query->mState = *(uint32_t *)(lVar4 + 0x28);
  query->mQueryTS = *(time_t *)(lVar4 + 0x30);
  uVar2 = *(undefined8 *)(lVar4 + 0x38);
  query->mQueryFlags = (int)uVar2;
  query->mSearchTime = (int)((ulong)uVar2 >> 0x20);
  std::
  _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
  ::operator=(&(query->mClosest)._M_t,
              (_Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
               *)(lVar4 + 0x48));
  std::
  _Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
  ::operator=(&(query->mPotentialPeers)._M_t,
              (_Rb_tree<bdMetric,_std::pair<const_bdMetric,_bdPeer>,_std::_Select1st<std::pair<const_bdMetric,_bdPeer>_>,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
               *)((long)p_Var5[1]._M_next + 0x78));
  lVar4 = (long)p_Var5[1]._M_next;
  if (&query->mProxiesUnknown != (list<bdPeer,_std::allocator<bdPeer>_> *)(lVar4 + 0xb8)) {
    std::__cxx11::list<bdPeer,std::allocator<bdPeer>>::
    _M_assign_dispatch<std::_List_const_iterator<bdPeer>>
              ((list<bdPeer,std::allocator<bdPeer>> *)&query->mProxiesUnknown,
               *(undefined8 *)(lVar4 + 0xb8));
    lVar4 = (long)p_Var5[1]._M_next;
  }
  if (&query->mProxiesFlagged != (list<bdPeer,_std::allocator<bdPeer>_> *)(lVar4 + 0xd0)) {
    std::__cxx11::list<bdPeer,std::allocator<bdPeer>>::
    _M_assign_dispatch<std::_List_const_iterator<bdPeer>>
              ((list<bdPeer,std::allocator<bdPeer>> *)&query->mProxiesFlagged,
               *(undefined8 *)(lVar4 + 0xd0));
    lVar4 = (long)p_Var5[1]._M_next;
  }
  query->mQueryIdlePeerRetryPeriod = *(int32_t *)(lVar4 + 0x40);
  return 1;
}

Assistant:

int bdQueryManager::QuerySummary(const bdNodeId *id, bdQuerySummary &query) {
	std::list<bdQuery *>::iterator it;
	for (it = mLocalQueries.begin(); it != mLocalQueries.end(); it++) {
		if ((*it)->mId == *id) {
			query.mId = (*it)->mId;
			query.mLimit = (*it)->mLimit;
			query.mState = (*it)->mState;
			query.mQueryTS = (*it)->mQueryTS;
			query.mQueryFlags = (*it)->mQueryFlags;
			query.mSearchTime = (*it)->mSearchTime;
			query.mClosest = (*it)->mClosest;
			query.mPotentialPeers = (*it)->mPotentialPeers;
			query.mProxiesUnknown = (*it)->mProxiesUnknown;
			query.mProxiesFlagged = (*it)->mProxiesFlagged;
 			query.mQueryIdlePeerRetryPeriod = (*it)->mQueryIdlePeerRetryPeriod;

			return 1;
		}
	}
	return 0;
}